

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O0

void NCONF_free(CONF *conf)

{
  CONF *conf_local;
  
  if (conf != (CONF *)0x0) {
    lh_CONF_SECTION_doall_arg((lhash_st_CONF_SECTION *)conf->meth_data,section_free_arg,(void *)0x0)
    ;
    lh_CONF_SECTION_free((lhash_st_CONF_SECTION *)conf->meth_data);
    lh_CONF_VALUE_doall_arg((lhash_st_CONF_VALUE *)conf->meth,value_free_arg,(void *)0x0);
    lh_CONF_VALUE_free((lhash_st_CONF_VALUE *)conf->meth);
    OPENSSL_free(conf);
  }
  return;
}

Assistant:

void NCONF_free(CONF *conf) {
  if (conf == NULL) {
    return;
  }

  lh_CONF_SECTION_doall_arg(conf->sections, section_free_arg, NULL);
  lh_CONF_SECTION_free(conf->sections);
  lh_CONF_VALUE_doall_arg(conf->values, value_free_arg, NULL);
  lh_CONF_VALUE_free(conf->values);
  OPENSSL_free(conf);
}